

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLNode * __thiscall tinyxml2::XMLElement::ShallowClone(XMLElement *this,XMLDocument *doc)

{
  char *pcVar1;
  XMLElement *this_00;
  char *value;
  XMLAttribute *local_28;
  XMLAttribute *a;
  XMLElement *element;
  XMLDocument *doc_local;
  XMLElement *this_local;
  
  element = (XMLElement *)doc;
  if (doc == (XMLDocument *)0x0) {
    element = (XMLElement *)(this->super_XMLNode)._document;
  }
  pcVar1 = XMLNode::Value(&this->super_XMLNode);
  this_00 = XMLDocument::NewElement((XMLDocument *)element,pcVar1);
  for (local_28 = FirstAttribute(this); local_28 != (XMLAttribute *)0x0;
      local_28 = XMLAttribute::Next(local_28)) {
    pcVar1 = XMLAttribute::Name(local_28);
    value = XMLAttribute::Value(local_28);
    SetAttribute(this_00,pcVar1,value);
  }
  return &this_00->super_XMLNode;
}

Assistant:

XMLNode* XMLElement::ShallowClone(XMLDocument* doc) const
{
    if (!doc) {
        doc = _document;
    }
    XMLElement* element =
        doc->NewElement(Value()); // fixme: this will always allocate memory. Intern?
    for (const XMLAttribute* a = FirstAttribute(); a; a = a->Next()) {
        element->SetAttribute(
            a->Name(), a->Value()); // fixme: this will always allocate memory. Intern?
    }
    return element;
}